

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_float.cpp
# Opt level: O0

short ximu::FixedFloat::toFixed(float floatValue,Qvals q)

{
  undefined4 local_14;
  int tmp;
  Qvals q_local;
  float floatValue_local;
  
  local_14 = (int)(floatValue * (float)(1 << ((byte)q & 0x1f)));
  if (local_14 < 0x8000) {
    if (local_14 < -0x8000) {
      local_14 = -0x8000;
    }
  }
  else {
    local_14._0_2_ = 0x7fff;
  }
  return (short)local_14;
}

Assistant:

short FixedFloat::toFixed(float floatValue, Qvals q) {
  int tmp = static_cast<int>(
      floatValue * static_cast<int>(1 << static_cast<int>(q)));

  if (tmp > 32767)
    tmp = 32767;
  else if (tmp < -32768)
    tmp = -32768;

  return static_cast<short>(tmp);
}